

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O1

void __thiscall Engine::makeDecision(Engine *this,DecInfo *di,int alt)

{
  long *plVar1;
  uint uVar2;
  mapped_type *pmVar3;
  undefined8 extraout_RAX;
  char *pcVar4;
  long lVar5;
  stringstream ss;
  uint local_1cc;
  undefined1 local_1c8 [32];
  stringstream local_1a8 [16];
  ostream local_198 [112];
  ios_base local_128 [264];
  
  this->nodes = this->nodes + 1;
  local_1cc = alt;
  if (altpath.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      altpath.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&altpath,
               (iterator)
               altpath.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
               ._M_finish,(int *)&local_1cc);
  }
  else {
    *altpath.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = alt;
    altpath.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = altpath.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish + 1;
  }
  if (di->var == (void *)0x0) {
    if ((so.print_nodes != false) || (profilerConnector->_connected == true)) {
      std::__cxx11::stringstream::stringstream(local_1a8);
      getLitString_abi_cxx11_((string *)local_1c8,local_1cc ^ di->val);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_198,(char *)local_1c8._0_8_,local_1c8._8_8_);
      if ((key_type)local_1c8._0_8_ != (key_type)(local_1c8 + 0x10)) {
        operator_delete((void *)local_1c8._0_8_);
      }
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)&mostRecentLabel_abi_cxx11_,(string *)local_1c8);
      if ((key_type)local_1c8._0_8_ != (key_type)(local_1c8 + 0x10)) {
        operator_delete((void *)local_1c8._0_8_);
      }
      std::__cxx11::stringstream::~stringstream(local_1a8);
      std::ios_base::~ios_base(local_128);
    }
    SAT::enqueue(&sat,(Lit)(local_1cc ^ di->val),(Reason)0x0);
  }
  else {
    if ((so.print_nodes != false) || (profilerConnector->_connected == true)) {
      std::__cxx11::stringstream::stringstream(local_1a8);
      local_1c8._0_8_ = di->var;
      pmVar3 = std::
               map<IntVar_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<IntVar_*>,_std::allocator<std::pair<IntVar_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&intVarString_abi_cxx11_,(key_type *)local_1c8);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_198,(pmVar3->_M_dataplus)._M_p,pmVar3->_M_string_length);
      uVar2 = di->type - 1;
      if (uVar2 < 3) {
        pcVar4 = &DAT_001dd538 + *(int *)(&DAT_001dd538 + (ulong)uVar2 * 4);
      }
      else {
        pcVar4 = "?=";
      }
      std::__ostream_insert<char,std::char_traits<char>>(local_198,pcVar4,2);
      std::ostream::operator<<((ostream *)local_198,di->val);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)&mostRecentLabel_abi_cxx11_,(string *)local_1c8);
      if ((key_type)local_1c8._0_8_ != (key_type)(local_1c8 + 0x10)) {
        operator_delete((void *)local_1c8._0_8_);
      }
      std::__cxx11::stringstream::~stringstream(local_1a8);
      std::ios_base::~ios_base(local_128);
    }
    uVar2 = local_1cc ^ di->type;
    if (3 < uVar2) {
      makeDecision();
      std::__cxx11::stringstream::~stringstream(local_1a8);
      std::ios_base::~ios_base(local_128);
      _Unwind_Resume(extraout_RAX);
    }
    plVar1 = (long *)di->var;
    lVar5 = (long)di->val;
    switch(uVar2) {
    case 0:
      (**(code **)(*plVar1 + 0x88))(plVar1,lVar5,0,1);
      break;
    case 1:
      (**(code **)(*plVar1 + 0x80))(plVar1,lVar5,0,1);
      break;
    case 2:
      (**(code **)(*plVar1 + 0x70))(plVar1,lVar5 + 1,0,1);
      break;
    case 3:
      (**(code **)(*plVar1 + 0x78))(plVar1,lVar5,0,1);
    }
  }
  if (((so.ldsb == true) && (di->var != (void *)0x0)) && (di->type == 1)) {
    LDSB::processDec(&ldsb,(Lit)(sat.trail.data[sat.trail.sz - 1].data)->x);
  }
  return;
}

Assistant:

inline void Engine::makeDecision(DecInfo& di, int alt) {
	++nodes;
	altpath.push_back(alt);
#ifdef HAS_VAR_IMPACT
	vec<int> sizes(0);
	if (last_int) last_int->updateImpact(processImpact(var_sizes, getVarSizes(sizes)));
#endif
	if (di.var != nullptr) {
#if DEBUG_VERBOSE
		std::cerr << "makeDecision: " << intVarString[(IntVar*)di.var] << " / " << di.val << " (" << alt
							<< ")" << std::endl;
#endif
#ifdef HAS_PROFILER
		if (doProfiling()) {
			std::stringstream ss;
			/* ss << intVarString[(IntVar*)di.var] << " / " << di.val << " (" << alt << ")"; */
			ss << intVarString[(IntVar*)di.var];
			switch (di.type) {
				case 1:
					ss << "==";
					break;
				case 2:
					ss << ">=";
					break;
				case 3:
					ss << "<=";
					break;
				default:
					ss << "?=";
					break;
			}
			ss << di.val;
			mostRecentLabel = ss.str();
		}
#endif
#ifdef HAS_VAR_IMPACT
		last_int = (IntVar*)di.var;
		if (sizes.size())
			sizes.moveTo(var_sizes);
		else
			getVarSizes(var_sizes);
#endif
		((IntVar*)di.var)->set(di.val, static_cast<LitRel>(di.type ^ alt));
	} else {
#if DEBUG_VERBOSE
		std::cerr << "enqueuing SAT literal: " << di.val << "^" << alt << " = " << (di.val ^ alt)
							<< std::endl;
#endif
#ifdef HAS_PROFILER
		if (doProfiling()) {
			std::stringstream ss;
			ss << getLitString(di.val ^ alt);
			mostRecentLabel = ss.str();
		}
#endif
#ifdef HAS_VAR_IMPACT
		last_int = nullptr;
#endif
		sat.enqueue(toLit(di.val ^ alt));
	}
	if (so.ldsb && (di.var != nullptr) && di.type == 1) {
		ldsb.processDec(sat.trail.last()[0]);
	}
	//  if (opt_var && di.var == opt_var && ((IntVar*) di.var)->isFixed()) printf("objective = %d\n",
	//  ((IntVar*) di.var)->getVal());
}